

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O2

string * __thiscall
soul::IdentifierPath::toString_abi_cxx11_(string *__return_storage_ptr__,IdentifierPath *this)

{
  Identifier *pIVar1;
  size_t i;
  ulong index;
  allocator<char> local_42;
  allocator<char> local_41;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,"::",&local_42);
  if ((this->pathSections).numActive == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pIVar1 = ArrayWithPreallocation<soul::Identifier,_8UL>::front(&this->pathSections);
    std::__cxx11::string::string<soul::Identifier,void>
              ((string *)__return_storage_ptr__,pIVar1,&local_41);
    for (index = 1; index < (this->pathSections).numActive; index = index + 1) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      pIVar1 = ArrayWithPreallocation<soul::Identifier,_8UL>::operator[](&this->pathSections,index);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      append<soul::Identifier>(__return_storage_ptr__,pIVar1);
    }
  }
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const
    {
        return joinStrings (pathSections, "::");
    }